

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockUnsizedNestedStructArrayCase::init
          (BlockUnsizedNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ShaderInterface *this_01;
  int iVar1;
  deUint32 dVar2;
  StructType *this_02;
  StructType *this_03;
  BufferBlock *this_04;
  int ndx;
  long lVar3;
  VarType local_a0;
  Random rnd;
  VarType local_48;
  
  this_01 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = bb::ShaderInterface::allocStruct(this_01,"S");
  glu::VarType::VarType((VarType *)&rnd,TYPE_UINT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&rnd,&local_a0,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType((VarType *)&rnd,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  this_03 = bb::ShaderInterface::allocStruct(this_01,"T");
  glu::VarType::VarType((VarType *)&rnd,TYPE_FLOAT_MAT4X3,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_03,"a",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::VarType(&local_a0,this_02);
  glu::VarType::VarType((VarType *)&rnd,&local_a0,3);
  glu::StructType::addMember(this_03,"b",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType((VarType *)&rnd,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(this_03,"c",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  this_04 = bb::ShaderInterface::allocBlock(this_01,"Block");
  glu::VarType::VarType(&local_a0,this_02);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"s",&local_a0,0x1000);
  this_00 = &this_04->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"v",&local_a0,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_a0,TYPE_UINT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"u",&local_a0,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_48,this_03);
  glu::VarType::VarType(&local_a0,&local_48,-1);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"t",&local_a0,0x800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::~VarType(&local_48);
  this_04->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_04->m_instanceName);
    bb::BufferBlock::setArraySize(this_04,this->m_numInstances);
  }
  deRandom_init(&rnd.m_rnd,0x1ef1);
  for (lVar3 = 0; iVar1 = this->m_numInstances + (uint)(this->m_numInstances == 0), lVar3 < iVar1;
      lVar3 = lVar3 + 1) {
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    (this_04->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar2 % 5 + 1;
  }
  return iVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT4X3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));
		typeT.addMember("c", VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), VarType::UNSIZED_ARRAY), ACCESS_READ));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(7921);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}